

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DTDScanner::scanElementDecl(DTDScanner *this)

{
  uint uVar1;
  XMLBufferMgr *this_00;
  DTDGrammar *pDVar2;
  XMLValidator *this_01;
  XMLCh *pXVar3;
  XMLScanner *this_02;
  DocTypeHandler *pDVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  DTDElementDecl *this_03;
  DTDElementDecl *pDVar7;
  XMLBufBid bbName;
  
  bVar5 = checkForPERef(this,false,true);
  if (!bVar5) {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  this_00 = this->fBufMgr;
  bbName.fBuffer = XMLBufferMgr::bidOnBuffer(this_00);
  bbName.fMgr = this_00;
  bVar5 = ReaderMgr::getName(this->fReaderMgr,bbName.fBuffer);
  if (bVar5) {
    pDVar2 = this->fDTDGrammar;
    uVar1 = this->fEmptyNamespaceId;
    (bbName.fBuffer)->fBuffer[(bbName.fBuffer)->fIndex] = L'\0';
    iVar6 = (*(pDVar2->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                      (pDVar2,(ulong)uVar1,0);
    this_03 = (DTDElementDecl *)CONCAT44(extraout_var,iVar6);
    if (this_03 == (DTDElementDecl *)0x0) {
      this_03 = (DTDElementDecl *)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
      pXVar3 = (bbName.fBuffer)->fBuffer;
      pXVar3[(bbName.fBuffer)->fIndex] = L'\0';
      DTDElementDecl::DTDElementDecl
                (this_03,pXVar3,this->fEmptyNamespaceId,Any,this->fGrammarPoolMemoryManager);
      (*(this->fDTDGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0x11])
                (this->fDTDGrammar,this_03,0);
    }
    else if ((this_03->super_XMLElementDecl).fCreateReason == Declared) {
      if (this->fScanner->fValScheme == Val_Always) {
        this_01 = this->fScanner->fValidator;
        pXVar3 = (bbName.fBuffer)->fBuffer;
        pXVar3[(bbName.fBuffer)->fIndex] = L'\0';
        XMLValidator::emitError
                  (this_01,ElementAlreadyExists,pXVar3,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      pDVar7 = this->fDumElemDecl;
      if (pDVar7 == (DTDElementDecl *)0x0) {
        pDVar7 = (DTDElementDecl *)XMemory::operator_new(0x58,this->fMemoryManager);
        pXVar3 = (bbName.fBuffer)->fBuffer;
        pXVar3[(bbName.fBuffer)->fIndex] = L'\0';
        DTDElementDecl::DTDElementDecl
                  (pDVar7,pXVar3,this->fEmptyNamespaceId,Any,this->fMemoryManager);
        this->fDumElemDecl = pDVar7;
      }
      else {
        pXVar3 = (bbName.fBuffer)->fBuffer;
        pXVar3[(bbName.fBuffer)->fIndex] = L'\0';
        XMLElementDecl::setElementName(&pDVar7->super_XMLElementDecl,pXVar3,this->fEmptyNamespaceId)
        ;
      }
    }
    pDVar7 = this->fDumElemDecl;
    (this_03->super_XMLElementDecl).fExternalElement =
         this->fDocTypeReaderId != this->fReaderMgr->fCurReader->fReaderNum;
    (this_03->super_XMLElementDecl).fCreateReason = Declared;
    bVar5 = checkForPERef(this,false,true);
    if (!bVar5) {
      XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
    }
    bVar5 = scanContentSpec(this,this_03);
    if (bVar5) {
      checkForPERef(this,false,true);
      bVar5 = ReaderMgr::skippedChar(this->fReaderMgr,L'>');
      if (!bVar5) {
        this_02 = this->fScanner;
        pXVar3 = (bbName.fBuffer)->fBuffer;
        pXVar3[(bbName.fBuffer)->fIndex] = L'\0';
        XMLScanner::emitError
                  (this_02,UnterminatedElementDecl,pXVar3,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      }
      pDVar4 = this->fDocTypeHandler;
      if (pDVar4 != (DocTypeHandler *)0x0) {
        (*pDVar4->_vptr_DocTypeHandler[7])(pDVar4,this_03,(ulong)(this_03 == pDVar7));
      }
    }
    else {
      ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
    }
  }
  else {
    XMLScanner::emitError(this->fScanner,ExpectedElementName);
    ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
  }
  XMLBufBid::~XMLBufBid(&bbName);
  return;
}

Assistant:

void DTDScanner::scanElementDecl()
{
    //
    //  Space is legal (required actually) here so check for a PE ref. If
    //  we don't get our whitespace, then issue and error, but try to keep
    //  going.
    //
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // Get a buffer for the element name and scan in the name
    XMLBufBid bbName(fBufMgr);
    if (!fReaderMgr->getName(bbName.getBuffer()))
    {
        fScanner->emitError(XMLErrs::ExpectedElementName);
        fReaderMgr->skipPastChar(chCloseAngle);
        return;
    }

    // Look this guy up in the element decl pool
    DTDElementDecl* decl = (DTDElementDecl*) fDTDGrammar->getElemDecl(fEmptyNamespaceId, 0, bbName.getRawBuffer(), Grammar::TOP_LEVEL_SCOPE);

    //
    //  If it does not exist, then we need to create it. If it does and
    //  its marked as declared, then that's an error, but we still need to
    //  scan over the content model so use the dummy declaration that the
    //  parsing code can fill in.
    //
    if (decl)
    {
        if (decl->isDeclared())
        {
            if (fScanner->getValidationScheme() == XMLScanner::Val_Always)
                fScanner->getValidator()->emitError(XMLValid::ElementAlreadyExists, bbName.getRawBuffer());

            if (!fDumElemDecl)
                fDumElemDecl = new (fMemoryManager) DTDElementDecl
                (
                    bbName.getRawBuffer()
                    , fEmptyNamespaceId
                    , DTDElementDecl::Any
                    , fMemoryManager
                );
            else
                fDumElemDecl->setElementName(bbName.getRawBuffer(),fEmptyNamespaceId);
        }
    }
     else
    {
        //
        //  Create the new empty declaration to fill in and put it into
        //  the decl pool.
        //
        decl = new (fGrammarPoolMemoryManager) DTDElementDecl
        (
            bbName.getRawBuffer()
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fGrammarPoolMemoryManager
        );
        fDTDGrammar->putElemDecl(decl);
    }

    // Set a flag for whether we will ignore this one
    const bool isIgnored = (decl == fDumElemDecl);

    // Mark this one if being externally declared
    decl->setExternalElemDeclaration(isReadingExternalEntity());

    // Mark this one as being declared
    decl->setCreateReason(XMLElementDecl::Declared);

    // Another check for a PE ref, with at least required whitespace
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // And now scan the content model for this guy.
    if (!scanContentSpec(*decl))
    {
        fReaderMgr->skipPastChar(chCloseAngle);
        return;
    }

    // Another check for a PE ref, but we don't require whitespace here
    checkForPERef(false, true);

    // And we should have the ending angle bracket
    if (!fReaderMgr->skippedChar(chCloseAngle))
    {
        fScanner->emitError(XMLErrs::UnterminatedElementDecl, bbName.getRawBuffer());
        fReaderMgr->skipPastChar(chCloseAngle);
    }

    //
    //  If we have a DTD handler tell it about the new element decl. We
    //  tell it if its one that can be ignored, cause its an override of a
    //  previously existing decl. If it is being ignored, only call back
    //  if advanced callbacks are enabled.
    //
    if (fDocTypeHandler)
        fDocTypeHandler->elementDecl(*decl, isIgnored);
}